

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

statusline checkhttpprefix(Curl_easy *data,char *s,size_t len)

{
  statusline sVar1;
  _Bool _Var2;
  statusline local_2c;
  statusline onmatch;
  statusline rc;
  curl_slist *head;
  size_t len_local;
  char *s_local;
  Curl_easy *data_local;
  
  _onmatch = (data->set).http200aliases;
  local_2c = STATUS_BAD;
  while ((sVar1 = local_2c, _onmatch != (curl_slist *)0x0 &&
         (_Var2 = checkprefixmax(_onmatch->data,s,len), sVar1 = (uint)(4 < len), !_Var2))) {
    _onmatch = _onmatch->next;
  }
  local_2c = sVar1;
  sVar1 = local_2c;
  if ((local_2c != STATUS_DONE) &&
     (_Var2 = checkprefixmax("HTTP/",s,len), sVar1 = (uint)(4 < len), !_Var2)) {
    sVar1 = local_2c;
  }
  local_2c = sVar1;
  return local_2c;
}

Assistant:

static statusline
checkhttpprefix(struct Curl_easy *data,
                const char *s, size_t len)
{
  struct curl_slist *head = data->set.http200aliases;
  statusline rc = STATUS_BAD;
  statusline onmatch = len >= 5? STATUS_DONE : STATUS_UNKNOWN;

  while(head) {
    if(checkprefixmax(head->data, s, len)) {
      rc = onmatch;
      break;
    }
    head = head->next;
  }

  if((rc != STATUS_DONE) && (checkprefixmax("HTTP/", s, len)))
    rc = onmatch;

  return rc;
}